

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcShow.c
# Opt level: O3

void Abc_NodeShowCut(Abc_Obj_t *pNode,int nNodeSizeMax,int nConeSizeMax)

{
  size_t __size;
  void *pvVar1;
  Abc_Obj_t *pAVar2;
  int iVar3;
  Abc_ManCut_t *pAVar4;
  Vec_Ptr_t *vLeaves;
  Vec_Ptr_t *pVVar5;
  Vec_Ptr_t *vVisited;
  void **ppvVar6;
  char *pName;
  FILE *pFVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  char FileNameDot [200];
  Abc_Obj_t *local_108;
  Abc_ManCut_t *local_100;
  char local_f8 [200];
  
  local_108 = pNode;
  if (pNode->pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNode->pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcShow.c"
                  ,0xd7,"void Abc_NodeShowCut(Abc_Obj_t *, int, int)");
  }
  pAVar4 = Abc_NtkManCutStart(nNodeSizeMax,nConeSizeMax,2,1000000000);
  vLeaves = Abc_NodeFindCut(pAVar4,pNode,1);
  pVVar5 = Abc_NtkManCutReadCutLarge(pAVar4);
  vVisited = Abc_NtkManCutReadVisited(pAVar4);
  Abc_NodeConeCollect(&local_108,1,pVVar5,vVisited,1);
  local_100 = pAVar4;
  pVVar5 = Abc_NodeCollectTfoCands(pAVar4,local_108,vLeaves,1000000000);
  iVar3 = pVVar5->nSize;
  if (0 < iVar3) {
    uVar8 = vVisited->nSize;
    lVar10 = 0;
    do {
      pvVar1 = pVVar5->pArray[lVar10];
      if (0 < (int)uVar8) {
        uVar9 = 0;
        do {
          if (vVisited->pArray[uVar9] == pvVar1) goto LAB_008835f8;
          uVar9 = uVar9 + 1;
        } while (uVar8 != uVar9);
      }
      if (uVar8 == vVisited->nCap) {
        if ((int)uVar8 < 0x10) {
          if (vVisited->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc(0x80);
          }
          else {
            ppvVar6 = (void **)realloc(vVisited->pArray,0x80);
          }
          vVisited->pArray = ppvVar6;
          vVisited->nCap = 0x10;
        }
        else {
          __size = (ulong)(uVar8 * 2) * 8;
          if (vVisited->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc(__size);
          }
          else {
            ppvVar6 = (void **)realloc(vVisited->pArray,__size);
          }
          vVisited->pArray = ppvVar6;
          vVisited->nCap = uVar8 * 2;
        }
      }
      else {
        ppvVar6 = vVisited->pArray;
      }
      iVar3 = vVisited->nSize;
      uVar8 = iVar3 + 1;
      vVisited->nSize = uVar8;
      ppvVar6[iVar3] = pvVar1;
      iVar3 = pVVar5->nSize;
LAB_008835f8:
      lVar10 = lVar10 + 1;
    } while (lVar10 < iVar3);
  }
  pName = Abc_ObjName(local_108);
  Abc_ShowGetFileName(pName,local_f8);
  pFVar7 = fopen(local_f8,"w");
  pAVar4 = local_100;
  pAVar2 = local_108;
  if (pFVar7 == (FILE *)0x0) {
    fprintf(_stdout,"Cannot open the intermediate file \"%s\".\n",local_f8);
  }
  else {
    uVar8 = vLeaves->nSize;
    if (uVar8 == vLeaves->nCap) {
      if ((int)uVar8 < 0x10) {
        if (vLeaves->pArray == (void **)0x0) {
          ppvVar6 = (void **)malloc(0x80);
        }
        else {
          ppvVar6 = (void **)realloc(vLeaves->pArray,0x80);
        }
        vLeaves->pArray = ppvVar6;
        vLeaves->nCap = 0x10;
      }
      else {
        if (vLeaves->pArray == (void **)0x0) {
          ppvVar6 = (void **)malloc((ulong)uVar8 << 4);
        }
        else {
          ppvVar6 = (void **)realloc(vLeaves->pArray,(ulong)uVar8 << 4);
        }
        vLeaves->pArray = ppvVar6;
        vLeaves->nCap = uVar8 * 2;
        pAVar4 = local_100;
      }
    }
    else {
      ppvVar6 = vLeaves->pArray;
    }
    iVar3 = vLeaves->nSize;
    vLeaves->nSize = iVar3 + 1;
    ppvVar6[iVar3] = pAVar2;
    Io_WriteDotNtk(local_108->pNtk,vVisited,vLeaves,local_f8,0,0);
    Abc_NtkManCutStop(pAVar4);
    Abc_ShowFile(local_f8);
  }
  return;
}

Assistant:

void Abc_NodeShowCut( Abc_Obj_t * pNode, int nNodeSizeMax, int nConeSizeMax )
{
    FILE * pFile;
    char FileNameDot[200];
    Abc_ManCut_t * p;
    Vec_Ptr_t * vCutSmall;
    Vec_Ptr_t * vCutLarge;
    Vec_Ptr_t * vInside;
    Vec_Ptr_t * vNodesTfo;
    Abc_Obj_t * pTemp;
    int i;

    assert( Abc_NtkIsStrash(pNode->pNtk) );

    // start the cut computation manager
    p = Abc_NtkManCutStart( nNodeSizeMax, nConeSizeMax, 2, ABC_INFINITY );
    // get the recovergence driven cut
    vCutSmall = Abc_NodeFindCut( p, pNode, 1 );
    // get the containing cut
    vCutLarge = Abc_NtkManCutReadCutLarge( p );
    // get the array for the inside nodes
    vInside = Abc_NtkManCutReadVisited( p );
    // get the inside nodes of the containing cone
    Abc_NodeConeCollect( &pNode, 1, vCutLarge, vInside, 1 );

    // add the nodes in the TFO 
    vNodesTfo = Abc_NodeCollectTfoCands( p, pNode, vCutSmall, ABC_INFINITY );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodesTfo, pTemp, i )
        Vec_PtrPushUnique( vInside, pTemp );

    // create the file name
    Abc_ShowGetFileName( Abc_ObjName(pNode), FileNameDot );
    // check that the file can be opened
    if ( (pFile = fopen( FileNameDot, "w" )) == NULL )
    {
        fprintf( stdout, "Cannot open the intermediate file \"%s\".\n", FileNameDot );
        return;
    }
    // add the root node to the cone (for visualization)
    Vec_PtrPush( vCutSmall, pNode );
    // write the DOT file
    Io_WriteDotNtk( pNode->pNtk, vInside, vCutSmall, FileNameDot, 0, 0 );
    // stop the cut computation manager
    Abc_NtkManCutStop( p );

    // visualize the file 
    Abc_ShowFile( FileNameDot );
}